

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O0

void __thiscall avro::json::JsonParser::expectToken(JsonParser *this,Token tk)

{
  bool bVar1;
  Token TVar2;
  ostream *poVar3;
  char *pcVar4;
  Exception *this_00;
  Token in_ESI;
  JsonParser *in_RDI;
  double dVar5;
  double dVar6;
  ostringstream oss;
  string *in_stack_fffffffffffffdc8;
  JsonParser *in_stack_fffffffffffffdd0;
  double local_1d8;
  double local_1d0;
  ostringstream local_188 [380];
  Token local_c;
  
  local_c = in_ESI;
  TVar2 = advance(in_stack_fffffffffffffdd0);
  if (TVar2 != local_c) {
    if (local_c != tkDouble) {
LAB_002037cc:
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar3 = std::operator<<((ostream *)local_188,"Incorrect token in the stream. Expected: ");
      pcVar4 = toString(local_c);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,", found ");
      TVar2 = cur(in_RDI);
      pcVar4 = toString(TVar2);
      std::operator<<(poVar3,pcVar4);
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      std::__cxx11::ostringstream::str();
      Exception::Exception(this_00,in_stack_fffffffffffffdc8);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    TVar2 = cur(in_RDI);
    if ((TVar2 == tkString) &&
       (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8),
         bVar1 || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffffdd0,
                                           (char *)in_stack_fffffffffffffdc8), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8),
        bVar1)))) {
      in_RDI->curToken = tkDouble;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      if (bVar1) {
        local_1d0 = std::numeric_limits<double>::infinity();
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
        dVar5 = std::numeric_limits<double>::infinity();
        dVar6 = std::numeric_limits<double>::quiet_NaN();
        local_1d8 = -dVar5;
        if (!bVar1) {
          local_1d8 = dVar6;
        }
        local_1d0 = local_1d8;
      }
      in_RDI->dv = local_1d0;
    }
    else {
      TVar2 = cur(in_RDI);
      if (TVar2 != tkLong) goto LAB_002037cc;
      in_RDI->dv = (double)in_RDI->lv;
    }
  }
  return;
}

Assistant:

void JsonParser::expectToken(Token tk)
{
    if (advance() != tk) {
        if (tk == tkDouble) {
            if(cur() == tkString
                && (sv == "Infinity" || sv == "-Infinity" || sv == "NaN")) {
                curToken = tkDouble;
                dv = sv == "Infinity" ?
                    std::numeric_limits<double>::infinity() :
                    sv == "-Infinity" ?
                        -std::numeric_limits<double>::infinity() :
                    std::numeric_limits<double>::quiet_NaN();
                return;
            } else if (cur() == tkLong) {
                dv = double(lv);
                return;
            }
        }
        ostringstream oss;
        oss << "Incorrect token in the stream. Expected: "
            << JsonParser::toString(tk) << ", found "
            << JsonParser::toString(cur());
        throw Exception(oss.str());
    }
}